

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go.h
# Opt level: O0

void __thiscall GoState<3U,_3U>::GoState(GoState<3U,_3U> *this)

{
  undefined4 uVar1;
  value_type_conflict *in_RDI;
  int j;
  int i;
  undefined4 in_stack_ffffffffffffffc0;
  uint local_38;
  uint local_34;
  
  *(undefined ***)in_RDI = &PTR__GoState_001f0718;
  in_RDI[5] = 0;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)0x1b1fee);
  in_RDI[0x12] = 0;
  in_RDI[0x13] = 1;
  uVar1 = (**(code **)(*(long *)in_RDI + 0x20))();
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             CONCAT44(uVar1,in_stack_ffffffffffffffc0),in_RDI);
  for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
      *(undefined1 *)((long)in_RDI + (long)(int)local_38 + (long)(int)local_34 * 3 + 8) = 0;
    }
  }
  return;
}

Assistant:

GoState():
		previous_board_hash_value(0),
		depth(0),
		player_to_move(1)
	{ 
		all_hash_values.insert(compute_hash_value());

		for (int i = 0; i < M; ++i) {
			for (int j = 0; j < N; ++j) {
				board[i][j] =  empty;
			}
		}
	}